

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

void strskip(char *s,char c,char e)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  char *in;
  
  cVar4 = *s;
  if (cVar4 != '\0') {
    pcVar3 = s + 1;
    bVar1 = false;
    do {
      if (cVar4 == c) {
LAB_001fa7a3:
        bVar2 = true;
        if ((cVar4 != e) && (bVar2 = bVar1, bVar1)) goto LAB_001fa7cf;
      }
      else {
        if (cVar4 == e) {
          if (!bVar1) goto LAB_001fa7a3;
LAB_001fa7c7:
          *s = e;
          s = s + 1;
          cVar4 = pcVar3[-1];
        }
        else if (bVar1) goto LAB_001fa7c7;
LAB_001fa7cf:
        *s = cVar4;
        s = s + 1;
        bVar2 = false;
      }
      bVar1 = bVar2;
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
  }
  *s = '\0';
  return;
}

Assistant:

void strskip(char *s, const char c, const char e) {
	char *in = s;
	char *out = s;
	bool escapeseen = false;
	while (*in) {
		if ((*in != c) && ((*in != e) || escapeseen)) {
			if (escapeseen) {
				/* Not escaping anything */
				*out = e;
				out++;
			}
			*out = *in;
			out++;
			escapeseen = false;
		} else if (*in == e) {
			/* Maybe escaping something */
			escapeseen = true;
		} else if (escapeseen) {
			/* Add the escaped character */
			*out = *in;
			out++;
			escapeseen = false;
		}
		in++;
	}
	*out = 0;
}